

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall
kratos::PackedSlice::PackedSlice
          (PackedSlice *this,Var *parent,PackedStructFieldDef *def,string *member_name)

{
  InternalException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *member_name_local;
  PackedStructFieldDef *def_local;
  Var *parent_local;
  PackedSlice *this_local;
  
  local_28 = member_name;
  member_name_local = &def->name;
  def_local = (PackedStructFieldDef *)parent;
  parent_local = (Var *)this;
  VarSlice::VarSlice(&this->super_VarSlice,parent,0,0);
  (this->super_VarSlice).super_Var.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_0059e648;
  this->def_ = (PackedStructFieldDef *)member_name_local;
  this->original_struct_ = (PackedStruct *)0x0;
  if (member_name_local[1]._M_string_length == 0) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    std::operator+(&local_48,"Invalid member access ",member_name_local);
    InternalException::InternalException(this_00,&local_48);
    __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
  }
  set_up(this,(PackedStruct *)member_name_local[1]._M_string_length,local_28);
  return;
}

Assistant:

PackedSlice::PackedSlice(Var *parent, const PackedStructFieldDef *def,
                         const std::string &member_name)
    : VarSlice(parent, 0, 0), def_(def) {
    if (!def->struct_) {
        throw InternalException("Invalid member access " + def->name);
    }
    set_up(*def->struct_, member_name);
}